

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GameBoard.cpp
# Opt level: O2

void __thiscall GameBoard::printGameStatistics(GameBoard *this)

{
  ostream *poVar1;
  _List_node_base *p_Var2;
  int iVar3;
  
  poVar1 = std::operator<<((ostream *)&std::cout,"Playing:");
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  std::endl<char,std::char_traits<char>>(poVar1);
  iVar3 = 1;
  p_Var2 = (_List_node_base *)&this->players;
  while (p_Var2 = (((_List_base<Player,_std::allocator<Player>_> *)&p_Var2->_M_next)->_M_impl).
                  _M_node.super__List_node_base._M_next, (this->it)._M_node = p_Var2,
        p_Var2 != (_List_node_base *)&this->players) {
    poVar1 = std::operator<<((ostream *)&std::cout,"Player ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,iVar3);
    std::endl<char,std::char_traits<char>>(poVar1);
    Player::PrintPlayerStats((Player *)((this->it)._M_node + 1));
    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    iVar3 = iVar3 + 1;
    p_Var2 = (this->it)._M_node;
  }
  return;
}

Assistant:

void GameBoard::printGameStatistics()                                   //prints all players' stats
{
    cout << "Playing:" << endl << endl;

    int count=1;

    for (it=players.begin(); it!=players.end(); it++)
    {
        cout << "Player " << count << endl;
        it->PrintPlayerStats();
        cout << endl;

        count++;
    }
}